

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedConstructorCode
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  FileDescriptor *file;
  size_t sVar3;
  size_type __n;
  OneofDescriptor *this_00;
  string *value;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  allocator<bool> local_4a;
  bool local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> processed;
  bool need_to_clear_cached_size;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"void $classname$::SharedCtor() {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  file = Descriptor::file(this->descriptor_);
  bVar1 = HasFieldPresence(file);
  if ((bVar1) && (sVar3 = HasBitsSize(this), (sVar3 & 7) != 0)) {
    io::Printer::Print(printer,"_cached_size_ = 0;\n");
    processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._7_1_ = 0;
  }
  __n = std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::size(&this->optimized_order_);
  local_49 = false;
  std::allocator<bool>::allocator(&local_4a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_48,__n,&local_49,&local_4a);
  std::allocator<bool>::~allocator(&local_4a);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,
             (vector<bool,_std::allocator<bool>_> *)local_48);
  GenerateConstructorBody(this,printer,(vector<bool,_std::allocator<bool>_> *)local_88,false);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_88)
  ;
  for (local_8c = 0; iVar2 = Descriptor::oneof_decl_count(this->descriptor_), local_8c < iVar2;
      local_8c = local_8c + 1) {
    this_00 = Descriptor::oneof_decl(this->descriptor_,local_8c);
    value = OneofDescriptor::name_abi_cxx11_(this_00);
    io::Printer::Print(printer,"clear_has_$oneof_name$();\n","oneof_name",value);
  }
  if ((processed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage._7_1_ & 1) != 0) {
    io::Printer::Print(printer,"_cached_size_ = 0;\n");
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_48)
  ;
  return;
}

Assistant:

void MessageGenerator::
GenerateSharedConstructorCode(io::Printer* printer) {
  printer->Print(
    "void $classname$::SharedCtor() {\n",
    "classname", classname_);
  printer->Indent();

  bool need_to_clear_cached_size = true;
  // We reproduce the logic used for laying out _cached_sized_ in the class
  // definition, as to initialize it in-order.
  if (HasFieldPresence(descriptor_->file()) &&
      (HasBitsSize() % 8) != 0) {
    printer->Print("_cached_size_ = 0;\n");
    need_to_clear_cached_size = false;
  }

  std::vector<bool> processed(optimized_order_.size(), false);
  GenerateConstructorBody(printer, processed, false);

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "clear_has_$oneof_name$();\n",
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }

  if (need_to_clear_cached_size) {
    printer->Print("_cached_size_ = 0;\n");
  }

  printer->Outdent();
  printer->Print("}\n\n");
}